

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::RoaringCompressState::InitializeContainer(RoaringCompressState *this)

{
  __int_type _Var1;
  bool bVar2;
  reference pvVar3;
  pointer pCVar4;
  validity_t *pvVar5;
  idx_t iVar6;
  value_type vVar7;
  data_ptr_t ptr;
  uint uVar8;
  ulong uVar9;
  undefined4 uStack_38;
  value_type metadata;
  
  _uStack_38 = this->analyze_state;
  if (this->total_count != _uStack_38->total_count) {
    pvVar3 = vector<duckdb::roaring::ContainerMetadata,_true>::get<true>
                       (this->container_metadata,this->total_count >> 0xb);
    vVar7 = *pvVar3;
    _uStack_38 = (RoaringAnalyzeState *)CONCAT44(vVar7,uStack_38);
    uVar9 = this->analyze_state->total_count - (ulong)(this->container_state).appended_count;
    if (0x7ff < uVar9) {
      uVar9 = 0x800;
    }
    uVar8 = (int)uVar9 + 0x3f;
    uVar9 = (ulong)(uVar8 & 0x1fc0);
    bVar2 = CanStore(this,uVar9,&metadata);
    if (!bVar2) {
      pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      iVar6 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).start;
      pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      _Var1 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
      FlushSegment(this);
      CreateEmptySegment(this,_Var1 + iVar6);
      vVar7.nulls = false;
      vVar7.count = 0;
      vVar7.container_type = metadata.container_type;
    }
    if (vVar7.container_type == RUN_CONTAINER) {
      ContainerCompressionState::OverrideRun
                (&this->container_state,&this->data_ptr,(ulong)metadata.count);
    }
    else if (((uint)vVar7 & 0xff) == 2) {
      ptr = (data_ptr_t)((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8);
      this->data_ptr = ptr;
      FastMemset(ptr,-1,(ulong)(uVar8 >> 3 & 0x3f8));
      (this->container_state).append_function = AppendBitset;
      pvVar5 = (validity_t *)((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8);
      this->data_ptr = (data_ptr_t)pvVar5;
      (this->container_state).uncompressed = pvVar5;
    }
    else {
      ContainerCompressionState::OverrideArray
                (&this->container_state,&this->data_ptr,metadata.nulls,(ulong)metadata.count);
    }
    iVar6 = ContainerMetadata::GetDataSizeInBytes(&metadata,uVar9);
    this->data_ptr = this->data_ptr + iVar6;
    ContainerMetadataCollection::AddMetadata(&this->metadata_collection,metadata);
  }
  return;
}

Assistant:

void RoaringCompressState::InitializeContainer() {
	if (total_count == analyze_state.total_count) {
		// No more containers left
		return;
	}
	auto container_index = GetContainerIndex();
	D_ASSERT(container_index < container_metadata.size());
	auto metadata = container_metadata[container_index];

	idx_t container_size = AlignValue<idx_t, ValidityMask::BITS_PER_VALUE>(
	    MinValue<idx_t>(analyze_state.total_count - container_state.appended_count, ROARING_CONTAINER_SIZE));
	if (!CanStore(container_size, metadata)) {
		idx_t row_start = current_segment->start + current_segment->count;
		FlushSegment();
		CreateEmptySegment(row_start);
	}

	// Override the pointer to write directly into the block
	if (metadata.IsUncompressed()) {
		data_ptr = reinterpret_cast<data_ptr_t>(AlignValue<idx_t>(reinterpret_cast<idx_t>(data_ptr)));
		FastMemset(data_ptr, ~0, sizeof(validity_t) * (container_size / ValidityMask::BITS_PER_VALUE));
		container_state.OverrideUncompressed(data_ptr);
	} else if (metadata.IsRun()) {
		auto number_of_runs = metadata.NumberOfRuns();
		container_state.OverrideRun(data_ptr, number_of_runs);
	} else {
		auto cardinality = metadata.Cardinality();
		container_state.OverrideArray(data_ptr, metadata.IsInverted(), cardinality);
	}
	data_ptr += metadata.GetDataSizeInBytes(container_size);
	metadata_collection.AddMetadata(metadata);
}